

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_sync_update_tables
              (rtr_socket *rtr_socket,pfx_table *pfx_table,spki_table *spki_table,
              aspa_table *aspa_table,pdu_ipv4 *ipv4_pdus,uint ipv4_pdu_count,pdu_ipv6 *ipv6_pdus,
              uint ipv6_pdu_count,pdu_router_key *router_key_pdus,uint router_key_pdu_count,
              pdu_aspa **aspa_pdus,size_t aspa_pdu_count,pdu_end_of_data_v0 *eod_pdu)

{
  ushort uVar1;
  pdu_aspa *ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  aspa_status aVar8;
  int iVar9;
  aspa_update_operation *operations;
  pdu_error_type pVar10;
  aspa_operation_type aVar11;
  pdu_aspa *ppVar12;
  size_t sVar13;
  _Bool *p_Var14;
  ulong ipv4_pdu_count_00;
  size_t sVar15;
  pdu_router_key *erroneous_pdu;
  pdu_ipv4 *pdu;
  pdu_ipv6 *pdu_00;
  long in_FS_OFFSET;
  bool bVar16;
  char txt [49];
  spki_record entry;
  aspa_update *local_100;
  char local_f8 [16];
  ulong local_e8;
  char acStack_e0 [40];
  spki_record local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_100 = (aspa_update *)0x0;
  ipv4_pdu_count_00 = (ulong)ipv4_pdu_count;
  bVar5 = true;
  if (ipv4_pdu_count != 0) {
    sVar15 = 0;
    pdu = ipv4_pdus;
    do {
      iVar7 = rtr_update_pfx_table(rtr_socket,pfx_table,pdu);
      if (iVar7 == -1) {
        bVar5 = false;
        lrtr_dbg("RTR Socket: error while updating v4 prefixes");
        iVar7 = rtr_undo_update_pfx_table_batch(rtr_socket,pfx_table,ipv4_pdus,sVar15,ipv6_pdus,0);
        bVar16 = iVar7 == -1;
        goto LAB_0010a623;
      }
      sVar15 = sVar15 + 1;
      pdu = pdu + 1;
    } while (ipv4_pdu_count_00 != sVar15);
  }
  bVar16 = false;
LAB_0010a623:
  bVar6 = bVar16;
  if ((bVar5) && (lrtr_dbg("RTR Socket: v4 prefixes added"), ipv6_pdu_count != 0)) {
    sVar15 = 0;
    pdu_00 = ipv6_pdus;
    do {
      iVar7 = rtr_update_pfx_table(rtr_socket,pfx_table,pdu_00);
      if (iVar7 == -1) {
        bVar5 = false;
        lrtr_dbg("RTR Socket: error while updating v6 prefixes");
        iVar7 = rtr_undo_update_pfx_table_batch
                          (rtr_socket,pfx_table,ipv4_pdus,ipv4_pdu_count_00,ipv6_pdus,sVar15);
        bVar6 = true;
        if (iVar7 != -1) {
          bVar6 = bVar16;
        }
        break;
      }
      sVar15 = sVar15 + 1;
      pdu_00 = pdu_00 + 1;
    } while (ipv6_pdu_count != sVar15);
  }
  if ((bVar5) && (lrtr_dbg("RTR Socket: v6 prefixes added"), router_key_pdu_count != 0)) {
    if (rtr_socket == (rtr_socket *)0x0) {
      __assert_fail("rtr_socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                    ,0x3ea,
                    "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                   );
    }
    if (router_key_pdus == (pdu_router_key *)0x0) {
      __assert_fail("pdu",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                    ,0x3eb,
                    "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                   );
    }
    sVar15 = 0;
    erroneous_pdu = router_key_pdus;
    do {
      if (spki_table != (spki_table *)0x0) {
        if (erroneous_pdu->type != '\t') {
          __assert_fail("type == ROUTER_KEY",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                        ,0x3f6,
                        "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                       );
        }
        local_b8.asn = erroneous_pdu->asn;
        uVar3 = *(undefined8 *)erroneous_pdu->ski;
        uVar4 = *(undefined8 *)(erroneous_pdu->ski + 8);
        local_b8.ski._0_4_ = SUB84(uVar3,0);
        local_b8.ski._4_2_ = SUB82((ulong)uVar3 >> 0x20,0);
        local_b8.ski._6_2_ = SUB82((ulong)uVar3 >> 0x30,0);
        local_b8.ski._8_4_ = SUB84(uVar4,0);
        local_b8.ski._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
        local_b8.ski[0xe] = (uint8_t)((ulong)uVar4 >> 0x30);
        local_b8.ski[0xf] = (uint8_t)((ulong)uVar4 >> 0x38);
        local_b8.ski._16_4_ = *(undefined4 *)(erroneous_pdu->ski + 0x10);
        memcpy(local_b8.spki,erroneous_pdu->spki,0x5b);
        local_b8.socket = rtr_socket;
        if (erroneous_pdu->flags == '\0') {
          iVar7 = spki_table_remove_entry(spki_table,&local_b8);
LAB_0010a803:
          if (iVar7 == -3) {
            lrtr_dbg("RTR Socket: Withdrawal of unknown router key");
            pVar10 = WITHDRAWAL_OF_UNKNOWN_RECORD;
LAB_0010a8a1:
            rtr_send_error_pdu_from_host(rtr_socket,erroneous_pdu,0x7b,pVar10,(char *)0x0,0);
          }
          else {
            if (iVar7 != -1) {
              if (iVar7 != -2) goto LAB_0010a812;
              lrtr_dbg("RTR Socket: Duplicate Announcement for router key: ASN: %u received",
                       (ulong)local_b8.asn);
              pVar10 = DUPLICATE_ANNOUNCEMENT;
              goto LAB_0010a8a1;
            }
            builtin_strncpy(local_f8,"spki_table Error",0x10);
            local_e8 = local_e8 & 0xffffffffffffff00;
            lrtr_dbg("RTR Socket: %s");
          }
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        }
        else {
          if (erroneous_pdu->flags == '\x01') {
            iVar7 = spki_table_add_entry(spki_table,&local_b8);
            goto LAB_0010a803;
          }
          builtin_strncpy(acStack_e0 + 8,"s value received",0x11);
          local_e8._0_1_ = 'i';
          local_e8._1_1_ = 't';
          local_e8._2_1_ = 'h';
          local_e8._3_1_ = ' ';
          local_e8._4_1_ = 'i';
          local_e8._5_1_ = 'n';
          local_e8._6_1_ = 'v';
          local_e8._7_1_ = 'a';
          builtin_strncpy(acStack_e0,"lid flag",8);
          builtin_strncpy(local_f8,"Router Key PDU w",0x10);
          lrtr_dbg("RTR Socket: %s",local_f8);
          rtr_send_error_pdu_from_host(rtr_socket,erroneous_pdu,0x7b,CORRUPT_DATA,local_f8,0x31);
        }
        bVar5 = false;
        lrtr_dbg("RTR Socket: error while updating spki data");
        iVar7 = rtr_undo_update_spki_table_batch(rtr_socket,spki_table,router_key_pdus,sVar15);
        iVar9 = rtr_undo_update_pfx_table_batch
                          (rtr_socket,pfx_table,ipv4_pdus,ipv4_pdu_count_00,ipv6_pdus,
                           (ulong)ipv6_pdu_count);
        if (iVar7 == -1) {
          bVar6 = true;
        }
        if (iVar9 == -1) {
          bVar6 = true;
        }
        break;
      }
      builtin_memcpy(local_b8.ski,"IGNORING INCOMING SP",0x14);
      local_b8.asn = 0x4f20494b;
      builtin_memcpy(local_b8.spki,"BJECTS",7);
      lrtr_dbg("RTR Socket: %s",&local_b8);
LAB_0010a812:
      sVar15 = sVar15 + 1;
      erroneous_pdu = erroneous_pdu + 1;
    } while (router_key_pdu_count != sVar15);
  }
  if (!bVar5) goto LAB_0010ac2f;
  lrtr_dbg("RTR Socket: spki data added");
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x42a,
                  "int rtr_compute_update_aspa_table(struct rtr_socket *, struct aspa_table *, struct pdu_aspa **, size_t, struct aspa_update **)"
                 );
  }
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x42b,
                  "int rtr_compute_update_aspa_table(struct rtr_socket *, struct aspa_table *, struct pdu_aspa **, size_t, struct aspa_update **)"
                 );
  }
  if (aspa_pdus == (pdu_aspa **)0x0 || aspa_pdu_count == 0) {
    if (aspa_pdu_count == 0 || aspa_pdus != (pdu_aspa **)0x0) goto LAB_0010ac2f;
  }
  else {
    operations = (aspa_update_operation *)lrtr_malloc(aspa_pdu_count * 0x30);
    if (operations == (aspa_update_operation *)0x0) {
      builtin_memcpy(local_b8.ski + 8,"ailed",6);
      builtin_memcpy(local_b8.ski,"Malloc f",8);
      lrtr_dbg("RTR Socket: %s");
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    }
    else {
      p_Var14 = &operations->is_no_op;
      sVar15 = 0;
      do {
        ppVar2 = aspa_pdus[sVar15];
        aVar11 = ppVar2->flags & ASPA_ADD;
        p_Var14[-0x20] = (_Bool)aVar11;
        *p_Var14 = false;
        ((aspa_record *)(p_Var14 + -0x18))->customer_asn = ppVar2->customer_asn;
        if (aVar11 == ASPA_REMOVE) {
          sVar13 = 0;
        }
        else {
          sVar13 = (size_t)ppVar2->provider_count;
        }
        *(size_t *)(p_Var14 + -0x10) = sVar13;
        ppVar12 = (pdu_aspa *)0x0;
        if (aVar11 != ASPA_REMOVE) {
          ppVar12 = ppVar2 + 1;
        }
        *(pdu_aspa **)(p_Var14 + -8) = ppVar12;
        ((aspa_update_operation *)(p_Var14 + -0x28))->index = sVar15;
        sVar15 = sVar15 + 1;
        p_Var14 = p_Var14 + 0x30;
      } while (aspa_pdu_count != sVar15);
      aVar8 = aspa_table_update_swap_in_compute
                        (aspa_table,rtr_socket,operations,aspa_pdu_count,&local_100);
      if ((local_100 == (aspa_update *)0x0) ||
         (local_100->failed_operation == (aspa_update_operation *)0x0)) {
        if (aVar8 == ASPA_SUCCESS) {
LAB_0010aafc:
          lrtr_dbg("RTR Socket: ASPA update computed");
          goto LAB_0010ac2f;
        }
        builtin_memcpy(local_b8.ski,"aspa_table Error",0x10);
        local_b8.ski._16_4_ = local_b8.ski._16_4_ & 0xffffff00;
        lrtr_dbg("RTR Socket: %s");
      }
      else {
        ppVar2 = aspa_pdus[local_100->failed_operation->index];
        uVar1 = ppVar2->provider_count;
        if (aVar8 == ASPA_RECORD_NOT_FOUND) {
          lrtr_dbg("RTR Socket: Withdrawal of unknown ASPA customer ASN: %u",
                   (ulong)ppVar2->customer_asn);
          pVar10 = WITHDRAWAL_OF_UNKNOWN_RECORD;
        }
        else {
          if (aVar8 != ASPA_DUPLICATE_RECORD) goto LAB_0010aafc;
          lrtr_dbg("RTR Socket: Duplicate Announcement for ASPA customer ASN: %u received",
                   (ulong)ppVar2->customer_asn);
          pVar10 = DUPLICATE_ANNOUNCEMENT;
        }
        rtr_send_error_pdu_from_host(rtr_socket,ppVar2,(uint)uVar1 * 4 + 0x10,pVar10,(char *)0x0,0);
      }
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    }
  }
  bVar5 = false;
  lrtr_dbg("RTR Socket: error while computing ASPA update");
  iVar7 = rtr_undo_update_spki_table_batch
                    (rtr_socket,spki_table,router_key_pdus,(ulong)router_key_pdu_count);
  iVar9 = rtr_undo_update_pfx_table_batch
                    (rtr_socket,pfx_table,ipv4_pdus,ipv4_pdu_count_00,ipv6_pdus,
                     (ulong)ipv6_pdu_count);
  if (iVar7 == -1) {
    bVar6 = true;
  }
  if (iVar9 == -1) {
    bVar6 = true;
  }
LAB_0010ac2f:
  if (bVar5) {
    aspa_table_update_swap_in_apply(&local_100);
    lrtr_dbg("RTR Socket: ASPA data added");
    rtr_socket->serial_number = eod_pdu->sn;
    iVar7 = 0;
    lrtr_dbg("RTR Socket: Sync successful, received %u Prefix PDUs, %u Router Key PDUs, %lu ASPA PDUs, session_id: %u, SN: %u"
             ,(ulong)(ipv6_pdu_count + ipv4_pdu_count),(ulong)router_key_pdu_count,aspa_pdu_count,
             (ulong)rtr_socket->session_id);
  }
  else {
    aspa_table_update_swap_in_discard(&local_100);
    if (bVar6) {
      rtr_socket->request_session_id = true;
    }
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    iVar7 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_sync_update_tables(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table,
				  struct spki_table *spki_table, struct aspa_table *aspa_table,
				  struct pdu_ipv4 *ipv4_pdus, const unsigned int ipv4_pdu_count,
				  struct pdu_ipv6 *ipv6_pdus, const unsigned int ipv6_pdu_count,
				  struct pdu_router_key *router_key_pdus, const unsigned int router_key_pdu_count,
				  struct pdu_aspa **aspa_pdus, const size_t aspa_pdu_count,
				  struct pdu_end_of_data_v0 *eod_pdu)
{
	bool proceed = true;
	bool undo_failed = false;
#if ASPA_UPDATE_MECHANISM == ASPA_SWAP_IN
	struct aspa_update *aspa_update = NULL;
#elif ASPA_UPDATE_MECHANISM == ASPA_IN_PLACE
	struct aspa_update_operation *aspa_failed_operation = NULL;
	struct aspa_update_operation *aspa_operations = NULL;
#else
#error "Invalid ASPA_UPDATE_MECHANISM value."
#endif /* ASPA_UPDATE_MECHANISM */

	// add all IPv4 prefix pdu to the pfx_table
	for (size_t i = 0; i < ipv4_pdu_count; i++) {
		if (rtr_update_pfx_table(rtr_socket, pfx_table, &(ipv4_pdus[i])) == RTR_ERROR) {
			RTR_DBG1("error while updating v4 prefixes");
			proceed = false;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, i, ipv6_pdus, 0) ==
			    RTR_ERROR)
				undo_failed = true;

			break;
		}
	}

	if (proceed) {
		RTR_DBG1("v4 prefixes added");

		// add all IPv6 prefix pdu to the pfx_table
		for (size_t i = 0; i < ipv6_pdu_count; i++) {
			if (rtr_update_pfx_table(rtr_socket, pfx_table, &(ipv6_pdus[i])) == RTR_ERROR) {
				RTR_DBG1("error while updating v6 prefixes");
				proceed = false;

				if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count,
								    ipv6_pdus, i) == RTR_ERROR)
					undo_failed = true;

				break;
			}
		}
	}

	if (proceed) {
		RTR_DBG1("v6 prefixes added");

		// add all router key pdu to the spki_table
		for (size_t i = 0; i < router_key_pdu_count; i++) {
			if (rtr_update_spki_table(rtr_socket, spki_table, &(router_key_pdus[i])) == RTR_ERROR) {
				RTR_DBG1("error while updating spki data");
				proceed = false;

				if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus, i) ==
				    RTR_ERROR)
					undo_failed = true;

				if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count,
								    ipv6_pdus, ipv6_pdu_count) == RTR_ERROR)
					undo_failed = true;

				break;
			}
		}
	}

#if ASPA_UPDATE_MECHANISM == ASPA_SWAP_IN
	if (proceed) {
		RTR_DBG1("spki data added");

		if (rtr_compute_update_aspa_table(rtr_socket, aspa_table, aspa_pdus, aspa_pdu_count, &aspa_update) ==
		    RTR_ERROR) {
			RTR_DBG1("error while computing ASPA update");
			proceed = false;

			if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus,
							     router_key_pdu_count) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count, ipv6_pdus,
							    ipv6_pdu_count) == RTR_ERROR)
				undo_failed = true;
		}
	}

	if (proceed) {
		aspa_table_update_swap_in_apply(&aspa_update);
		RTR_DBG1("ASPA data added");
	} else {
		aspa_table_update_swap_in_discard(&aspa_update);
	}

#elif ASPA_UPDATE_MECHANISM == ASPA_IN_PLACE
	if (proceed) {
		RTR_DBG1("spki data added");

		if (rtr_update_aspa_table(rtr_socket, aspa_table, aspa_pdus, aspa_pdu_count, &aspa_operations,
					  &aspa_failed_operation) == RTR_ERROR) {
			RTR_DBG1("error while updating ASPA data");
			proceed = false;

			if (rtr_undo_update_aspa_table(rtr_socket, aspa_table, aspa_operations, aspa_pdu_count,
						       aspa_failed_operation) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus,
							     router_key_pdu_count) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count, ipv6_pdus,
							    ipv6_pdu_count) == RTR_ERROR)
				undo_failed = true;
		}
	}

	if (proceed)
		RTR_DBG1("ASPA data added");

	aspa_table_update_in_place_cleanup(&aspa_operations, aspa_pdu_count);
	aspa_failed_operation = NULL;
#else
#error "Invalid ASPA_UPDATE_MECHANISM value."
#endif /* ASPA_UPDATE_MECHANISM */

	// An update attempted above failed
	if (!proceed) {
		if (undo_failed)
			// undo failed, so request new session
			rtr_socket->request_session_id = true;

		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	rtr_socket->serial_number = eod_pdu->sn;
	RTR_DBG("Sync successful, received %u Prefix PDUs, %u Router Key PDUs, %lu ASPA PDUs, session_id: %u, SN: %u",
		(ipv4_pdu_count + ipv6_pdu_count), router_key_pdu_count, aspa_pdu_count, rtr_socket->session_id,
		rtr_socket->serial_number);

	return RTR_SUCCESS;
}